

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

int gmlc::utilities::string_viewOps::toIntSimple(string_view input)

{
  char cVar1;
  const_iterator pvVar2;
  value_type_conflict1 testChar;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  int ret;
  char *local_28;
  int local_14;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_14 = 0;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_10);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_10);
  for (; local_28 != pvVar2; local_28 = local_28 + 1) {
    cVar1 = *local_28;
    if (('/' < cVar1) && (cVar1 < ':')) {
      local_14 = local_14 * 10 + cVar1 + -0x30;
    }
  }
  return local_14;
}

Assistant:

int toIntSimple(std::string_view input)
{
    int ret = 0;
    for (auto testChar : input) {
        if (testChar >= '0' && testChar <= '9') {
            ret = 10 * ret + (testChar - '0');
        }
    }
    return ret;
}